

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_const_value.h
# Opt level: O0

string * __thiscall
t_const_value::get_identifier_name_abi_cxx11_(string *__return_storage_ptr__,t_const_value *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string local_98 [32];
  string local_78 [35];
  undefined1 local_55;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  size_t s;
  t_const_value *local_18;
  t_const_value *this_local;
  string *ret;
  
  s._7_1_ = 0;
  local_18 = this;
  this_local = (t_const_value *)__return_storage_ptr__;
  get_identifier_abi_cxx11_(__return_storage_ptr__,this);
  local_28 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  if (local_28 != -1) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_78);
    std::__cxx11::string::~string(local_78);
    local_28 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if (local_28 != -1) {
      std::__cxx11::string::substr((ulong)local_98,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
      std::__cxx11::string::~string(local_98);
    }
    return __return_storage_ptr__;
  }
  local_55 = 1;
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_48,"error: identifier ",__return_storage_ptr__);
  std::operator+(__return_storage_ptr___00,&local_48," is unqualified!");
  local_55 = 0;
  __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
              std::__cxx11::string::~string);
}

Assistant:

std::string get_identifier_name() const {
    std::string ret = get_identifier();
    size_t s = ret.find('.');
    if (s == std::string::npos) {
      throw "error: identifier " + ret + " is unqualified!";
    }
    ret = ret.substr(s + 1);
    s = ret.find('.');
    if (s != std::string::npos) {
      ret = ret.substr(s + 1);
    }
    return ret;
  }